

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpuintegration.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26552d::CpuIntegrationTest_stack_Test::TestBody
          (CpuIntegrationTest_stack_Test *this)

{
  code *pcVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AssertHelper local_1f8;
  Message local_1f0;
  uint8_t local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_7;
  uint8_t i_3;
  Message local_1c0;
  uint8_t local_1b5;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_6;
  Message local_198;
  uint8_t local_18d;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  Message local_170;
  uint8_t local_165;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_4;
  Message local_148;
  uint8_t local_13d;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  uint8_t i_2;
  Message local_118;
  uint8_t local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  uint8_t i_1;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  int total_cycles;
  int second_loop;
  int first_loop;
  int pre_loop;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  uint8_t i;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  iterator local_88;
  size_type local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  allocator<unsigned_char> local_49;
  uchar local_48 [16];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  CpuIntegrationTest_stack_Test *local_10;
  CpuIntegrationTest_stack_Test *this_local;
  
  local_48[0] = 0xa2;
  local_48[1] = 0;
  local_48[2] = 0xa0;
  local_48[3] = 0;
  local_48[4] = 0x8a;
  local_48[5] = 0x99;
  local_48[6] = 0;
  local_48[7] = 2;
  local_48[8] = 0x48;
  local_48[9] = 0xe8;
  local_48[10] = 200;
  local_48[0xb] = 0xc0;
  local_48[0xc] = 0x10;
  local_48[0xd] = 0xd0;
  local_48[0xe] = 0xf5;
  local_48[0xf] = 0x68;
  local_38 = local_48;
  local_30 = 0x10;
  local_10 = this;
  std::allocator<unsigned_char>::allocator(&local_49);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l_00,&local_49);
  CpuIntegrationTest::load_hex_dump(&this->super_CpuIntegrationTest,0x600,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator(&local_49);
  pre_loop._1_1_ = 0x99;
  pre_loop._2_1_ = 0;
  pre_loop._3_1_ = 2;
  local_90 = 200;
  local_8f = 0xc0;
  local_8e = 0x20;
  i = 0xd0;
  local_8c = 0xf7;
  local_8b = 0;
  local_8a = 0;
  local_89 = 0;
  local_88 = (iterator)((long)&pre_loop + 1);
  local_80 = 0xb;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)&pre_loop);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,__l,(allocator<unsigned_char> *)&pre_loop);
  CpuIntegrationTest::load_hex_dump(&this->super_CpuIntegrationTest,0x610,&local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&pre_loop);
  for (first_loop._3_1_ = 0; first_loop._3_1_ < 0x21; first_loop._3_1_ = first_loop._3_1_ + 1) {
    n_e_s::core::test::FakeMmu::write_byte
              (&(this->super_CpuIntegrationTest).mmu,first_loop._3_1_ + 0x200,0xba);
  }
  CpuIntegrationTest::set_reset_address(&this->super_CpuIntegrationTest,0x600);
  CpuIntegrationTest::set_break_address(&this->super_CpuIntegrationTest,0xdead);
  (this->super_CpuIntegrationTest).expected.x = '\x10';
  (this->super_CpuIntegrationTest).expected.y = ' ';
  (this->super_CpuIntegrationTest).expected.sp =
       (this->super_CpuIntegrationTest).registers.sp + 0xfd;
  (this->super_CpuIntegrationTest).expected.pc = 0xdead;
  (this->super_CpuIntegrationTest).expected.p = '\x03';
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0xff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x239;
  local_bc = CpuIntegrationTest::run_until_brk(&this->super_CpuIntegrationTest,10000);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b8,"total_cycles","run_until_brk()",(int *)&gtest_ar.message_,
             &local_bc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xf6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_e0,"expected","registers",&(this->super_CpuIntegrationTest).expected,
             &(this->super_CpuIntegrationTest).registers);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
               ,0xf7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff10,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff10);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = 0;
  while( true ) {
    if (0xf < gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._7_1_) {
      gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._7_1_ = 0;
      while( true ) {
        if (0xf < gtest_ar_3.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._7_1_) {
          local_164 = 6;
          local_165 = n_e_s::core::test::FakeMmu::read_byte
                                (&(this->super_CpuIntegrationTest).mmu,0x1ff);
          testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
                    ((EqHelper *)local_160,"0x06","mmu.read_byte(kStackOffset + 0xFF)",&local_164,
                     &local_165);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar2) {
            testing::Message::Message(&local_170);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                       ,0x104,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_170);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          local_18c = 0x1a;
          local_18d = n_e_s::core::test::FakeMmu::read_byte
                                (&(this->super_CpuIntegrationTest).mmu,0x1fe);
          testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
                    ((EqHelper *)local_188,"0x18 + 2","mmu.read_byte(kStackOffset + 0xFE)",
                     &local_18c,&local_18d);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
          if (!bVar2) {
            testing::Message::Message(&local_198);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                       ,0x105,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_198);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_198);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
          local_1b4 = (this->super_CpuIntegrationTest).expected.p | 0x10;
          local_1b5 = n_e_s::core::test::FakeMmu::read_byte
                                (&(this->super_CpuIntegrationTest).mmu,0x1fd);
          testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
                    ((EqHelper *)local_1b0,"expected.p | B_FLAG",
                     "mmu.read_byte(kStackOffset + 0xFD)",(int *)&local_1b4,&local_1b5);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
          if (!bVar2) {
            testing::Message::Message(&local_1c0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffe38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                       ,0x106,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffe38,&local_1c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe38)
            ;
            testing::Message::~Message(&local_1c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          gtest_ar_7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._7_1_ = 3;
          while( true ) {
            if (0xf < gtest_ar_7.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._7_1_) {
              return;
            }
            if (SBORROW4(0x1ff,(uint)gtest_ar_7.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._7_1_)) break;
            local_1e1 = n_e_s::core::test::FakeMmu::read_byte
                                  (&(this->super_CpuIntegrationTest).mmu,
                                   0x1ff - gtest_ar_7.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._7_1_);
            testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
                      ((EqHelper *)local_1e0,"i","mmu.read_byte(kStackOffset + 0xFF - i)",
                       (uchar *)((long)&gtest_ar_7.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 7),&local_1e1);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
            if (!bVar2) {
              testing::Message::Message(&local_1f0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
              testing::internal::AssertHelper::AssertHelper
                        (&local_1f8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                         ,0x109,pcVar4);
              testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
              testing::internal::AssertHelper::~AssertHelper(&local_1f8);
              testing::Message::~Message(&local_1f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
            gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._7_1_ =
                 gtest_ar_7.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._7_1_ + 1;
          }
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        iVar3 = 0xf - (uint)gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._7_1_;
        if (SBORROW4(0xf,(uint)gtest_ar_3.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._7_1_)) break;
        local_13c = iVar3;
        if (SCARRY4((uint)gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._7_1_,0x210)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        local_13d = n_e_s::core::test::FakeMmu::read_byte
                              (&(this->super_CpuIntegrationTest).mmu,
                               gtest_ar_3.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._7_1_ + 0x210);
        testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
                  ((EqHelper *)local_138,"0x0F - i","mmu.read_byte(0x0210 + i)",&local_13c,
                   &local_13d);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar2) {
          testing::Message::Message(&local_148);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                     ,0xff,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_148);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_148);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        gtest_ar_3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._7_1_ =
             gtest_ar_3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._7_1_ + 1;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (SCARRY4((uint)gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._7_1_,0x200)) break;
    local_109 = n_e_s::core::test::FakeMmu::read_byte
                          (&(this->super_CpuIntegrationTest).mmu,
                           gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._7_1_ + 0x200);
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
              ((EqHelper *)local_108,"i","mmu.read_byte(0x0200 + i)",
               (uchar *)((long)&gtest_ar_2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 7),&local_109);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar2) {
      testing::Message::Message(&local_118);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffee0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpuintegration.cpp"
                 ,0xfb,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffee0,&local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffee0);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._7_1_ =
         gtest_ar_2.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._7_1_ + 1;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_F(CpuIntegrationTest, stack) {
    // Address  Hexdump   Dissassembly
    // -------------------------------
    // $0600    a2 00     LDX #$00
    // $0602    a0 00     LDY #$00
    // $0604    8a        TXA
    // $0605    99 00 02  STA $0200,Y
    // $0608    48        PHA
    // $0609    e8        INX
    // $060a    c8        INY
    // $060b    c0 10     CPY #$10
    // $060d    d0 f5     BNE $0604
    // $060f    68        PLA
    // $0610    99 00 02  STA $0200,Y
    // $0613    c8        INY
    // $0614    c0 20     CPY #$20
    // $0616    d0 f7     BNE $060f
    // $0618    00        BRK
    load_hex_dump(0x0600,
            {0xa2,
                    0x00,
                    0xa0,
                    0x00,
                    0x8a,
                    0x99,
                    0x00,
                    0x02,
                    0x48,
                    0xe8,
                    0xc8,
                    0xc0,
                    0x10,
                    0xd0,
                    0xf5,
                    0x68});
    load_hex_dump(0x0610,
            {0x99,
                    0x00,
                    0x02,
                    0xc8,
                    0xc0,
                    0x20,
                    0xd0,
                    0xf7,
                    0x00,
                    0x00,
                    0x00}); // Needed for previous BRK dummy read

    // STA with absolute indexed addressing will first read from the effective
    // address before writing to it, so we need to initialize the fake mmu with
    // some data at those addresses.
    for (uint8_t i = 0; i <= 0x20; ++i) {
        mmu.write_byte(
                static_cast<uint16_t>(0x0200) + i, static_cast<uint8_t>(0xBA));
    }

    set_reset_address(0x0600);
    set_break_address(0xDEAD);

    expected.x = 0x10;
    expected.y = 0x20;
    expected.sp =
            registers.sp - static_cast<uint8_t>(3); // PC (2 bytes) + P (1 byte)
    expected.pc = 0xDEAD;
    expected.p = C_FLAG | Z_FLAG;

    const int pre_loop = 2 + 2;
    const int first_loop = (2 + 5 + 3 + 2 + 2 + 2) * 16 + 15 * 3 + 2;
    const int second_loop = (4 + 5 + 2 + 2) * 16 + 15 * 3 + 2;
    const int total_cycles = pre_loop + first_loop + second_loop + 7;

    EXPECT_EQ(total_cycles, run_until_brk());
    EXPECT_EQ(expected, registers);

    // Written in first loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(0x0200 + i));
    }
    // Written in second loop
    for (uint8_t i = 0; i < 0x10; ++i) {
        EXPECT_EQ(0x0F - i, mmu.read_byte(0x0210 + i));
    }
    // Verify stack content
    // BRK pushes three bytes (PC + 2 and P) and overwrites what the first loop
    // wrote.
    EXPECT_EQ(0x06, mmu.read_byte(kStackOffset + 0xFF));
    EXPECT_EQ(0x18 + 2, mmu.read_byte(kStackOffset + 0xFE));
    EXPECT_EQ(expected.p | B_FLAG, mmu.read_byte(kStackOffset + 0xFD));

    for (uint8_t i = 3; i < 0x10; ++i) {
        EXPECT_EQ(i, mmu.read_byte(kStackOffset + 0xFF - i));
    }
}